

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

void multipcm_w_quick(void *info,UINT8 offset,UINT8 data)

{
  MultiPCM *ptChip;
  UINT8 data_local;
  UINT8 offset_local;
  void *info_local;
  
  *(INT32 *)((long)info + 0x10a8) = VALUE_TO_CHANNEL[(int)(uint)offset >> 3];
  *(uint *)((long)info + 0x10ac) = offset & 7;
  if (*(int *)((long)info + 0x10a8) != -1) {
    write_slot((MultiPCM *)info,
               (slot_t *)((long)info + (long)*(int *)((long)info + 0x10a8) * 0x98 + 8),
               *(INT32 *)((long)info + 0x10ac),data);
  }
  return;
}

Assistant:

static void multipcm_w_quick(void *info, UINT8 offset, UINT8 data)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	ptChip->cur_slot = VALUE_TO_CHANNEL[(offset >> 3) & 0x1F];
	ptChip->address = offset & 0x07;
	if (ptChip->cur_slot == -1)
		return;
	write_slot(ptChip, ptChip->slots + ptChip->cur_slot, ptChip->address, data);
}